

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

string * __thiscall
cmCTest::GetScheduleType_abi_cxx11_(string *__return_storage_ptr__,cmCTest *this)

{
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var1;
  long lVar2;
  
  _Var1._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar2 = *(long *)&((_Var1._M_head_impl)->ScheduleType)._M_dataplus;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar2,
             *(size_type *)((long)&(_Var1._M_head_impl)->ScheduleType + 8) + lVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::GetScheduleType() const
{
  return this->Impl->ScheduleType;
}